

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptconfig.c
# Opt level: O0

int configAppMatch(poptContext con,char *s)

{
  int iVar1;
  int local_24;
  int rc;
  char *s_local;
  poptContext con_local;
  
  if (con->appName == (char *)0x0) {
    con_local._4_4_ = 1;
  }
  else {
    iVar1 = glob_pattern_p(s,1);
    if (iVar1 == 0) {
      local_24 = strcmp(s,con->appName);
    }
    else {
      local_24 = fnmatch(s,con->appName,configAppMatch::flags);
    }
    con_local._4_4_ = local_24;
  }
  return con_local._4_4_;
}

Assistant:

static int configAppMatch(poptContext con, const char * s)
{
    int rc = 1;

    if (con->appName == NULL)	/* XXX can't happen. */
	return rc;

#if defined(HAVE_GLOB_H) && defined(HAVE_FNMATCH_H)
    if (glob_pattern_p(s, 1)) {
	static int flags = FNM_PATHNAME | FNM_PERIOD;
#ifdef FNM_EXTMATCH
	flags |= FNM_EXTMATCH;
#endif
	rc = fnmatch(s, con->appName, flags);
    } else
#endif
	rc = strcmp(s, con->appName);
    return rc;
}